

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph_manager.cpp
# Opt level: O1

GenerateJoinRelation __thiscall
duckdb::QueryGraphManager::GenerateJoins
          (QueryGraphManager *this,
          vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
          *extracted_relations,JoinRelationSet *set)

{
  optional_ptr<duckdb::JoinRelationSet,_true> *this_00;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *pvVar1;
  _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  NeighborInfo *pNVar2;
  pointer poVar3;
  idx_t iVar4;
  optional_ptr<duckdb::FilterInfo,_true> oVar5;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var6;
  pointer puVar7;
  idx_t iVar8;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var9;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var10;
  unsafe_unique_array<idx_t> *puVar11;
  undefined1 auVar12 [8];
  undefined8 uVar13;
  optional_ptr<duckdb::JoinRelationSet,_true> oVar14;
  __node_base _Var15;
  bool bVar16;
  __node_base_ptr p_Var17;
  pointer pDVar18;
  reference pvVar19;
  reference pvVar20;
  BoundConjunctionExpression *pBVar21;
  pointer pLVar22;
  type pFVar23;
  reference pvVar24;
  pointer pFVar25;
  pointer pEVar26;
  BoundComparisonExpression *pBVar27;
  LogicalComparisonJoin *pLVar28;
  pointer pLVar29;
  InternalException *this_02;
  LogicalComparisonJoin *in_RCX;
  ulong uVar30;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var31;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var32;
  _Hash_node_base *p_Var33;
  pointer *__ptr;
  long lVar34;
  _Head_base<0UL,_duckdb::JoinRelationSet_*,_false> _Var35;
  bool bVar36;
  __hash_code __code;
  optional_ptr<duckdb::FilterInfo,_true> *this_03;
  pointer puVar37;
  element_type *peVar38;
  GenerateJoinRelation GVar39;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  result_operator;
  JoinCondition cond;
  GenerateJoinRelation left;
  GenerateJoinRelation right;
  type condition;
  templated_unique_single_t join;
  optional_ptr<duckdb::JoinRelationSet,_true> result_relation;
  optional_ptr<duckdb::JoinRelationSet,_true> left_node;
  optional_ptr<duckdb::JoinRelationSet,_true> right_node;
  value_type chosen_filter;
  GenerateJoinRelation *result;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_110;
  undefined1 local_108 [8];
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> _Stack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e0 [24];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_c8;
  pointer local_c0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_b0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_a8;
  optional_ptr<duckdb::JoinRelationSet,_true> local_a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_80;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  __node_base local_68;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  _Head_base<0UL,_duckdb::JoinRelationSet_*,_false> local_50;
  optional_ptr<duckdb::FilterInfo,_true> local_48;
  _Hash_node_base *local_40;
  __node_base local_38;
  
  local_a0.ptr = (JoinRelationSet *)0x0;
  local_68._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_head_impl = (LogicalOperator *)0x0;
  local_110._M_head_impl = (LogicalOperator *)0x0;
  pvVar1 = extracted_relations + 9;
  local_c0 = (pointer)extracted_relations;
  local_38._M_nxt = (_Hash_node_base *)this;
  optional_ptr<const_std::unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>,_true>
  ::CheckValid((optional_ptr<const_std::unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>,_true>
                *)pvVar1);
  this_01 = (_Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(pvVar1->
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (undefined1  [8])in_RCX;
  p_Var17 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_find_before_node
                      (this_01,(ulong)in_RCX % this_01->_M_bucket_count,(key_type *)local_108,
                       (__hash_code)in_RCX);
  if (p_Var17 == (__node_base_ptr)0x0) {
    p_Var33 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var33 = p_Var17->_M_nxt;
  }
  optional_ptr<const_std::unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>,_true>
  ::CheckValid((optional_ptr<const_std::unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>,_true>
                *)pvVar1);
  if (p_Var33 == (_Hash_node_base *)0x0) {
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_108 = (undefined1  [8])&local_f8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"Join Order Optimizer Error: No full plan was created","");
    InternalException::InternalException(this_02,(string *)local_108);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  p_Var33 = p_Var33 + 2;
  pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
            operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                        *)p_Var33);
  if (pDVar18->is_leaf == false) {
    unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator->
              ((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true> *)
               p_Var33);
    GenerateJoins((QueryGraphManager *)local_e0,
                  (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                   *)local_c0,set);
    unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator->
              ((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true> *)
               p_Var33);
    GenerateJoins((QueryGraphManager *)(local_e0 + 0x10),
                  (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                   *)local_c0,set);
    pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
              operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                          *)p_Var33);
    optional_ptr<duckdb::NeighborInfo,_true>::CheckValid(&pDVar18->info);
    pNVar2 = (pDVar18->info).ptr;
    if ((pNVar2->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pNVar2->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)(local_e0 + 8));
      iVar8 = pLVar22->estimated_cardinality;
      pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_c8);
      iVar4 = pLVar22->estimated_cardinality;
      local_58._M_head_impl = (LogicalOperator *)local_e0._8_8_;
      local_e0._8_8_ = (LogicalOperator *)0x0;
      local_60._M_head_impl = local_c8._M_head_impl;
      local_c8._M_head_impl = (LogicalOperator *)0x0;
      LogicalCrossProduct::Create
                ((LogicalCrossProduct *)local_108,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_58,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_60);
      auVar12 = local_108;
      _Var31._M_head_impl = local_110._M_head_impl;
      local_108 = (undefined1  [8])0x0;
      local_110._M_head_impl = (LogicalOperator *)auVar12;
      if (_Var31._M_head_impl != (LogicalOperator *)0x0) {
        (*(code *)((_Hash_node_base *)(_Var31._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)();
      }
      if (local_108 != (undefined1  [8])0x0) {
        (**(code **)((long)(((unsafe_unique_array<idx_t> *)local_108)->
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)
                           ._M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false> + 8))();
      }
      local_108 = (undefined1  [8])0x0;
      if (local_60._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_60._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_60._M_head_impl = (LogicalOperator *)0x0;
      if (local_58._M_head_impl != (LogicalOperator *)0x0) {
        (*(code *)((_Hash_node_base *)(local_58._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)();
      }
      local_58._M_head_impl = (LogicalOperator *)0x0;
      pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_110);
      LogicalOperator::SetEstimatedCardinality(pLVar22,iVar8 * iVar4);
    }
    else {
      pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                            *)p_Var33);
      optional_ptr<duckdb::NeighborInfo,_true>::CheckValid(&pDVar18->info);
      pNVar2 = (pDVar18->info).ptr;
      poVar3 = (pNVar2->filters).
               super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
               .
               super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pNVar2->filters).
          super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
          .
          super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == poVar3) {
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      local_48.ptr = poVar3->ptr;
      lVar34 = 0;
      uVar30 = 0;
      while( true ) {
        pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                  operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                              *)p_Var33);
        optional_ptr<duckdb::NeighborInfo,_true>::CheckValid(&pDVar18->info);
        pNVar2 = (pDVar18->info).ptr;
        if ((ulong)((long)(pNVar2->filters).
                          super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          .
                          super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar2->filters).
                          super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          .
                          super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar30) break;
        pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                  operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                              *)p_Var33);
        optional_ptr<duckdb::NeighborInfo,_true>::CheckValid(&pDVar18->info);
        pNVar2 = (pDVar18->info).ptr;
        poVar3 = (pNVar2->filters).
                 super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                 .
                 super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pNVar2->filters).
                          super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          .
                          super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3 >> 3) <= uVar30)
        {
LAB_00c83d4a:
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar30);
        }
        this_03 = (optional_ptr<duckdb::FilterInfo,_true> *)((long)&poVar3->ptr + lVar34);
        optional_ptr<duckdb::FilterInfo,_true>::CheckValid(this_03);
        if (this_03->ptr->join_type == INNER) {
          pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                    operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                                *)p_Var33);
          optional_ptr<duckdb::NeighborInfo,_true>::CheckValid(&pDVar18->info);
          pNVar2 = (pDVar18->info).ptr;
          poVar3 = (pNVar2->filters).
                   super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                   .
                   super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pNVar2->filters).
                            super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                            .
                            super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3 >> 3) <=
              uVar30) goto LAB_00c83d4a;
          local_48.ptr = poVar3[uVar30].ptr;
          break;
        }
        uVar30 = uVar30 + 1;
        lVar34 = lVar34 + 8;
      }
      optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&local_48);
      oVar5.ptr = local_48.ptr;
      pLVar28 = (LogicalComparisonJoin *)operator_new(0x118);
      LogicalComparisonJoin::LogicalComparisonJoin
                (pLVar28,(oVar5.ptr)->join_type,LOGICAL_COMPARISON_JOIN);
      local_b0._M_head_impl = (LogicalOperator *)pLVar28;
      pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_b0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_e0 + 8));
      pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_b0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_c8);
      local_40 = p_Var33;
      pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                            *)p_Var33);
      optional_ptr<duckdb::NeighborInfo,_true>::CheckValid(&pDVar18->info);
      pNVar2 = (pDVar18->info).ptr;
      _Var35._M_head_impl =
           (JoinRelationSet *)
           (pNVar2->filters).
           super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
           .
           super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_50._M_head_impl =
           (JoinRelationSet *)
           (pNVar2->filters).
           super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
           .
           super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (_Var35._M_head_impl != local_50._M_head_impl) {
        do {
          oVar5.ptr = *(FilterInfo **)_Var35._M_head_impl;
          peVar38 = local_c0[10].type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((ulong)((long)local_c0[10].type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi - (long)peVar38 >> 3) <= (oVar5.ptr)->filter_index) {
            ::std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          pFVar25 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
                    operator->((unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>
                                *)((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    *)&peVar38->_vptr_ExtraTypeInfo + (oVar5.ptr)->filter_index));
          local_b8._M_head_impl =
               (pFVar25->filter).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pFVar25->filter).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
          optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                    ((optional_ptr<duckdb::JoinRelationSet,_true> *)local_e0);
          uVar13 = local_e0._0_8_;
          optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&(oVar5.ptr)->left_set);
          bVar16 = JoinRelationSet::IsSubset((JoinRelationSet *)uVar13,((oVar5.ptr)->left_set).ptr);
          bVar36 = !bVar16;
          if ((!bVar16) && ((byte)((oVar5.ptr)->join_type - SEMI) < 2)) {
            pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)&local_b0);
            pvVar19 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,0);
            pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)&local_b0);
            pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,1);
            _Var31._M_head_impl =
                 (pvVar19->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar19->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            _Var32._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            _Var6._M_head_impl =
                 (pvVar19->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar19->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 _Var32._M_head_impl;
            if (_Var6._M_head_impl != (LogicalOperator *)0x0) {
              (**(code **)((long)(_Var6._M_head_impl)->_vptr_LogicalOperator + 8))();
            }
            _Var32._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 _Var31._M_head_impl;
            if (_Var32._M_head_impl != (LogicalOperator *)0x0) {
              (**(code **)((long)(_Var32._M_head_impl)->_vptr_LogicalOperator + 8))();
            }
            bVar36 = false;
          }
          pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_b8);
          if ((pEVar26->super_BaseExpression).expression_class == BOUND_COMPARISON) {
            local_70._M_head_impl = local_b8._M_head_impl;
            local_b8._M_head_impl = (Expression *)0x0;
            MaybeInvertConditions
                      ((JoinCondition *)local_108,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_70,bVar36);
            if (local_70._M_head_impl != (Expression *)0x0) {
              (*((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_70._M_head_impl = (Expression *)0x0;
            pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)&local_b0);
            ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
            emplace_back<duckdb::JoinCondition>
                      (&(pLVar29->conditions).
                        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                       (JoinCondition *)local_108);
            if (_Stack_100._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                0x0) {
              (*((BaseExpression *)
                _Stack_100._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                _vptr_BaseExpression[1])();
            }
            _Stack_100._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 0x0;
            if (local_108 != (undefined1  [8])0x0) {
              (*(((LogicalJoin *)local_108)->super_LogicalOperator)._vptr_LogicalOperator[1])();
            }
          }
          else {
            pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)&local_b8);
            if ((pEVar26->super_BaseExpression).expression_class == BOUND_CONJUNCTION) {
              pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)&local_b8);
              pBVar21 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                                  (&pEVar26->super_BaseExpression);
              puVar7 = (pBVar21->children).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (puVar37 = (pBVar21->children).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; puVar37 != puVar7;
                  puVar37 = puVar37 + 1) {
                local_78._M_head_impl =
                     (puVar37->
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                (puVar37->
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
                .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0
                ;
                MaybeInvertConditions
                          ((JoinCondition *)local_108,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_78,bVar36);
                if (local_78._M_head_impl != (Expression *)0x0) {
                  (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                }
                local_78._M_head_impl = (Expression *)0x0;
                pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                        *)&local_b0);
                ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
                emplace_back<duckdb::JoinCondition>
                          (&(pLVar29->conditions).
                            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                           ,(JoinCondition *)local_108);
                if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     )_Stack_100._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                    (Expression *)0x0) {
                  (**(code **)(*(long *)_Stack_100._M_t.
                                        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                        .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                        _M_head_impl + 8))();
                }
                _Stack_100._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                     (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                     (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      )0x0;
                if (local_108 != (undefined1  [8])0x0) {
                  (*(((LogicalJoin *)local_108)->super_LogicalOperator)._vptr_LogicalOperator[1])();
                }
              }
            }
          }
          if (local_b8._M_head_impl != (Expression *)0x0) {
            (*((local_b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          _Var35._M_head_impl = _Var35._M_head_impl + 8;
        } while (_Var35._M_head_impl != local_50._M_head_impl);
      }
      _Var32._M_head_impl = local_b0._M_head_impl;
      _Var31._M_head_impl = local_110._M_head_impl;
      local_b0._M_head_impl = (LogicalOperator *)0x0;
      local_110._M_head_impl = _Var32._M_head_impl;
      if (_Var31._M_head_impl != (LogicalOperator *)0x0) {
        (*(code *)((_Hash_node_base *)(_Var31._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)();
      }
      p_Var33 = local_40;
      if (local_b0._M_head_impl != (LogicalOperator *)0x0) {
        (*(code *)((_Hash_node_base *)(local_b0._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)();
        p_Var33 = local_40;
      }
    }
    local_a0.ptr = (JoinRelationSet *)local_e0._0_8_;
    local_68._M_nxt = (_Hash_node_base *)local_e0._16_8_;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
              ((optional_ptr<duckdb::JoinRelationSet,_true> *)local_e0);
    uVar13 = local_e0._0_8_;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
              ((optional_ptr<duckdb::JoinRelationSet,_true> *)(local_e0 + 0x10));
    local_a8._M_head_impl =
         (LogicalOperator *)
         JoinRelationSetManager::Union
                   ((JoinRelationSetManager *)(local_c0 + 6),(JoinRelationSet *)uVar13,
                    (JoinRelationSet *)local_e0._16_8_);
    _Var31._M_head_impl = (LogicalOperator *)local_e0._8_8_;
    if (local_c8._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_c8._M_head_impl)->_vptr_LogicalOperator[1])();
      _Var31._M_head_impl = (LogicalOperator *)local_e0._8_8_;
    }
  }
  else {
    pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
              operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                          *)p_Var33);
    local_a8._M_head_impl = (LogicalOperator *)pDVar18->set;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
              ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_a8);
    pvVar19 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                            *)set,*(unsigned_long *)
                                   (((unsafe_unique_array<idx_t> *)
                                    &(local_a8._M_head_impl)->_vptr_LogicalOperator)->
                                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                   )._M_t.
                                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                   .super__Head_base<0UL,_unsigned_long_*,_false>);
    _Var32._M_head_impl =
         (pvVar19->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar19->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    _Var31._M_head_impl = local_110._M_head_impl;
    local_110._M_head_impl = _Var32._M_head_impl;
  }
  if (_Var31._M_head_impl != (LogicalOperator *)0x0) {
    (*(code *)((_Hash_node_base *)(_Var31._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)();
  }
  pDVar18 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
            operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                        *)p_Var33);
  iVar8 = pDVar18->cardinality;
  pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_110);
  pLVar22->estimated_cardinality = iVar8;
  pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_110);
  pLVar22->has_estimated_cardinality = true;
  peVar38 = local_c0[10].type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50._M_head_impl =
       (JoinRelationSet *)
       local_c0[10].type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (peVar38 != (element_type *)local_50._M_head_impl) {
    local_c0 = (pointer)&local_c0[10].type_info_;
    do {
      pFVar23 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
                operator*((unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>
                           *)peVar38);
      pvVar24 = vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
                              *)local_c0,pFVar23->filter_index);
      pFVar25 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
                operator->(pvVar24);
      if (((Expression *)
           (pFVar25->filter).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) &&
         (((pFVar23->set)._M_data)->count != 0)) {
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_a8);
        bVar16 = JoinRelationSet::IsSubset
                           ((JoinRelationSet *)local_a8._M_head_impl,(pFVar23->set)._M_data);
        if (bVar16) {
          pvVar24 = vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
                                  *)local_c0,pFVar23->filter_index);
          pFVar25 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
                    operator->(pvVar24);
          _Var9.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (pFVar25->filter).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>;
          (pFVar25->filter).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
          if (((Expression *)local_a0.ptr == (Expression *)0x0) ||
             ((pFVar23->left_set).ptr == (JoinRelationSet *)0x0)) {
            local_80._M_head_impl = local_110._M_head_impl;
            local_110._M_head_impl = (LogicalOperator *)0x0;
            local_e0._0_8_ = (Expression *)0x0;
            local_88 = _Var9.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            PushFilter((duckdb *)local_108,
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)&local_80,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_88);
            auVar12 = local_108;
            _Var31._M_head_impl = local_110._M_head_impl;
            local_108 = (undefined1  [8])0x0;
            local_110._M_head_impl = (LogicalOperator *)auVar12;
            if (_Var31._M_head_impl != (LogicalOperator *)0x0) {
              (*(_Var31._M_head_impl)->_vptr_LogicalOperator[1])();
            }
            local_108 = (undefined1  [8])0x0;
            if (local_88._M_head_impl != (Expression *)0x0) {
              (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_88._M_head_impl = (Expression *)0x0;
            if ((LogicalComparisonJoin *)local_80._M_head_impl != (LogicalComparisonJoin *)0x0) {
              (*(((LogicalJoin *)&(local_80._M_head_impl)->_vptr_LogicalOperator)->
                super_LogicalOperator)._vptr_LogicalOperator[1])();
            }
            local_80._M_head_impl = (LogicalOperator *)0x0;
          }
          else {
            local_e0._0_8_ = _Var9.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&local_a0);
            oVar14.ptr = local_a0.ptr;
            this_00 = &pFVar23->left_set;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(this_00);
            bVar16 = JoinRelationSet::IsSubset(oVar14.ptr,this_00->ptr);
            if (bVar16) {
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                        ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_68);
              _Var15._M_nxt = local_68._M_nxt;
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pFVar23->right_set);
              bVar16 = JoinRelationSet::IsSubset
                                 ((JoinRelationSet *)_Var15._M_nxt,(pFVar23->right_set).ptr);
              if (!bVar16) goto LAB_00c839f9;
              bVar16 = true;
LAB_00c83a52:
              bVar36 = false;
            }
            else {
LAB_00c839f9:
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                        ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_68);
              _Var15._M_nxt = local_68._M_nxt;
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(this_00);
              bVar16 = JoinRelationSet::IsSubset((JoinRelationSet *)_Var15._M_nxt,this_00->ptr);
              if (!bVar16) {
                bVar16 = false;
                goto LAB_00c83a52;
              }
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&local_a0);
              oVar14.ptr = local_a0.ptr;
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pFVar23->right_set);
              bVar16 = JoinRelationSet::IsSubset(oVar14.ptr,(pFVar23->right_set).ptr);
              bVar36 = bVar16;
            }
            if (bVar16 == false) {
              local_90._M_head_impl = local_110._M_head_impl;
              local_110._M_head_impl = (LogicalOperator *)0x0;
              local_98._M_head_impl = (Expression *)local_e0._0_8_;
              local_e0._0_8_ = (Expression *)0x0;
              PushFilter((duckdb *)local_108,
                         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_90,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_98);
              auVar12 = local_108;
              _Var31._M_head_impl = local_110._M_head_impl;
              local_108 = (undefined1  [8])0x0;
              local_110._M_head_impl = (LogicalOperator *)auVar12;
              if (_Var31._M_head_impl != (LogicalOperator *)0x0) {
                (*(_Var31._M_head_impl)->_vptr_LogicalOperator[1])();
              }
              local_108 = (undefined1  [8])0x0;
              if (local_98._M_head_impl != (Expression *)0x0) {
                (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
              }
              local_98._M_head_impl = (Expression *)0x0;
              if ((LogicalComparisonJoin *)local_90._M_head_impl != (LogicalComparisonJoin *)0x0) {
                (*(((LogicalJoin *)&(local_90._M_head_impl)->_vptr_LogicalOperator)->
                  super_LogicalOperator)._vptr_LogicalOperator[1])();
              }
              local_90._M_head_impl = (LogicalOperator *)0x0;
            }
            else {
              local_108 = (undefined1  [8])0x0;
              _Stack_100._M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                   (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   )0x0;
              pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)local_e0);
              pBVar27 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                                  (&pEVar26->super_BaseExpression);
              _Var10._M_head_impl =
                   (&pBVar27->left)[bVar36].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              (&pBVar27->left)[bVar36].
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
              if (local_108 != (undefined1  [8])0x0) {
                puVar11 = (unsafe_unique_array<idx_t> *)local_108;
                local_108 = (undefined1  [8])_Var10._M_head_impl;
                (**(code **)((long)(puVar11->
                                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                   )._M_t.
                                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                   .super__Head_base<0UL,_unsigned_long_*,_false> + 8))();
                _Var10._M_head_impl = (Expression *)local_108;
              }
              local_108 = (undefined1  [8])_Var10._M_head_impl;
              _Var10._M_head_impl =
                   (&pBVar27->left)[bVar36 ^ 1U].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              (&pBVar27->left)[bVar36 ^ 1U].
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
              if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                  _Stack_100._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                  (Expression *)0x0) {
                lVar34 = *(long *)_Stack_100._M_t.
                                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                _Stack_100._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                     (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                     (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                     _Var10._M_head_impl;
                (**(code **)(lVar34 + 8))();
                _Var10._M_head_impl =
                     (Expression *)
                     _Stack_100._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              }
              _Stack_100._M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                   (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                   _Var10._M_head_impl;
              local_f8._M_local_buf[0] = (pBVar27->super_Expression).super_BaseExpression.type;
              if (bVar36 != false) {
                local_f8._M_local_buf[0] = FlipComparisonExpression(local_f8._M_local_buf[0]);
              }
              _Var31._M_head_impl = local_110._M_head_impl;
              if ((local_110._M_head_impl)->type == LOGICAL_FILTER) {
                pvVar19 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                          ::operator[](&(local_110._M_head_impl)->children,0);
                _Var31._M_head_impl =
                     (pvVar19->
                     super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
              }
              if ((((LogicalComparisonJoin *)_Var31._M_head_impl)->super_LogicalJoin).
                  super_LogicalOperator.type == LOGICAL_CROSS_PRODUCT) {
                pLVar28 = (LogicalComparisonJoin *)operator_new(0x118);
                LogicalComparisonJoin::LogicalComparisonJoin(pLVar28,INNER,LOGICAL_COMPARISON_JOIN);
                local_e0._16_8_ = pLVar28;
                pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                        *)(local_e0 + 0x10));
                pvVar1 = &(((LogicalComparisonJoin *)_Var31._M_head_impl)->super_LogicalJoin).
                          super_LogicalOperator.children;
                pvVar19 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                          ::operator[](pvVar1,0);
                ::std::
                vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                            *)&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,pvVar19);
                pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                        *)(local_e0 + 0x10));
                pvVar19 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                          ::operator[](pvVar1,1);
                ::std::
                vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                            *)&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,pvVar19);
                pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                        *)(local_e0 + 0x10));
                ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
                emplace_back<duckdb::JoinCondition>
                          (&(pLVar29->conditions).
                            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                           ,(JoinCondition *)local_108);
                uVar13 = local_e0._16_8_;
                _Var32._M_head_impl = local_110._M_head_impl;
                local_e0._16_8_ = (JoinRelationSet *)0x0;
                if (_Var31._M_head_impl == local_110._M_head_impl) {
                  local_110._M_head_impl = (LogicalOperator *)uVar13;
                }
                else {
                  pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                          *)&local_110);
                  pvVar19 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                            ::operator[](&pLVar22->children,0);
                  _Var32._M_head_impl =
                       (pvVar19->
                       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
                  (pvVar19->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                       (LogicalOperator *)uVar13;
                }
                if ((LogicalComparisonJoin *)_Var32._M_head_impl != (LogicalComparisonJoin *)0x0) {
                  (*(((LogicalComparisonJoin *)_Var32._M_head_impl)->super_LogicalJoin).
                    super_LogicalOperator._vptr_LogicalOperator[1])();
                }
                if ((JoinRelationSet *)local_e0._16_8_ != (JoinRelationSet *)0x0) {
                  (**(code **)((long)(((unsafe_unique_array<idx_t> *)local_e0._16_8_)->
                                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                     )._M_t.
                                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                     .super__Head_base<0UL,_unsigned_long_*,_false> + 8))();
                }
              }
              else {
                ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
                emplace_back<duckdb::JoinCondition>
                          ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
                           &((LogicalComparisonJoin *)_Var31._M_head_impl)->conditions,
                           (JoinCondition *)local_108);
              }
              if (_Stack_100._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                  (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                  0x0) {
                (*(*(_func_int ***)
                    _Stack_100._M_t.
                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)[1])();
              }
              _Stack_100._M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
              if (local_108 != (undefined1  [8])0x0) {
                (*(((LogicalJoin *)local_108)->super_LogicalOperator)._vptr_LogicalOperator[1])();
              }
            }
          }
          if ((Expression *)local_e0._0_8_ != (Expression *)0x0) {
            (*((BaseExpression *)local_e0._0_8_)->_vptr_BaseExpression[1])();
          }
        }
      }
      peVar38 = (element_type *)&peVar38->type;
    } while (peVar38 != (element_type *)local_50._M_head_impl);
  }
  (((RelationManager *)&(local_38._M_nxt)->_M_nxt)->relation_mapping)._M_h._M_buckets =
       (__buckets_ptr)local_a8._M_head_impl;
  local_38._M_nxt[1] = (_Hash_node_base)local_110._M_head_impl;
  GVar39.op.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       local_a8._M_head_impl;
  GVar39.set.ptr = (JoinRelationSet *)local_38._M_nxt;
  return GVar39;
}

Assistant:

GenerateJoinRelation QueryGraphManager::GenerateJoins(vector<unique_ptr<LogicalOperator>> &extracted_relations,
                                                      JoinRelationSet &set) {
	optional_ptr<JoinRelationSet> left_node;
	optional_ptr<JoinRelationSet> right_node;
	optional_ptr<JoinRelationSet> result_relation;
	unique_ptr<LogicalOperator> result_operator;

	auto dp_entry = plans->find(set);
	if (dp_entry == plans->end()) {
		throw InternalException("Join Order Optimizer Error: No full plan was created");
	}
	auto &node = dp_entry->second;
	if (!dp_entry->second->is_leaf) {

		// generate the left and right children
		auto left = GenerateJoins(extracted_relations, node->left_set);
		auto right = GenerateJoins(extracted_relations, node->right_set);
		if (dp_entry->second->info->filters.empty()) {
			// no filters, create a cross product
			auto cardinality = left.op->estimated_cardinality * right.op->estimated_cardinality;
			result_operator = LogicalCrossProduct::Create(std::move(left.op), std::move(right.op));
			result_operator->SetEstimatedCardinality(cardinality);
		} else {
			// we have filters, create a join node
			auto chosen_filter = node->info->filters.at(0);
			for (idx_t i = 0; i < node->info->filters.size(); i++) {
				if (node->info->filters.at(i)->join_type == JoinType::INNER) {
					chosen_filter = node->info->filters.at(i);
					break;
				}
			}
			auto join = make_uniq<LogicalComparisonJoin>(chosen_filter->join_type);
			// Here we optimize build side probe side. Our build side is the right side
			// So the right plans should have lower cardinalities.
			join->children.push_back(std::move(left.op));
			join->children.push_back(std::move(right.op));

			// set the join conditions from the join node
			for (auto &filter_ref : node->info->filters) {
				auto f = filter_ref.get();
				// extract the filter from the operator it originally belonged to
				D_ASSERT(filters_and_bindings[f->filter_index]->filter);
				auto &filter_and_binding = filters_and_bindings.at(f->filter_index);
				auto condition = std::move(filter_and_binding->filter);
				// now create the actual join condition
				D_ASSERT((JoinRelationSet::IsSubset(*left.set, *f->left_set) &&
				          JoinRelationSet::IsSubset(*right.set, *f->right_set)) ||
				         (JoinRelationSet::IsSubset(*left.set, *f->right_set) &&
				          JoinRelationSet::IsSubset(*right.set, *f->left_set)));

				bool invert = !JoinRelationSet::IsSubset(*left.set, *f->left_set);
				// If the left and right set are inverted AND it is a semi or anti join
				// swap left and right children back.

				if (invert && (f->join_type == JoinType::SEMI || f->join_type == JoinType::ANTI)) {
					std::swap(join->children[0], join->children[1]);
					invert = false;
				}

				if (condition->GetExpressionClass() == ExpressionClass::BOUND_COMPARISON) {
					auto cond = MaybeInvertConditions(std::move(condition), invert);
					join->conditions.push_back(std::move(cond));
				} else if (condition->GetExpressionClass() == ExpressionClass::BOUND_CONJUNCTION) {
					auto &conjunction = condition->Cast<BoundConjunctionExpression>();
					for (auto &child : conjunction.children) {
						D_ASSERT(child->GetExpressionClass() == ExpressionClass::BOUND_COMPARISON);
						auto cond = MaybeInvertConditions(std::move(child), invert);
						join->conditions.push_back(std::move(cond));
					}
				}
			}
			D_ASSERT(!join->conditions.empty());
			result_operator = std::move(join);
		}
		left_node = left.set;
		right_node = right.set;
		result_relation = &set_manager.Union(*left.set, *right.set);
	} else {
		// base node, get the entry from the list of extracted relations
		D_ASSERT(node->set.count == 1);
		D_ASSERT(extracted_relations[node->set.relations[0]]);
		result_relation = &node->set;
		result_operator = std::move(extracted_relations[result_relation->relations[0]]);
	}
	// TODO: this is where estimated properties start coming into play.
	//  when creating the result operator, we should ask the cost model and cardinality estimator what
	//  the cost and cardinality are
	//	result_operator->estimated_props = node.estimated_props->Copy();
	result_operator->estimated_cardinality = node->cardinality;
	result_operator->has_estimated_cardinality = true;
	// check if we should do a pushdown on this node
	// basically, any remaining filter that is a subset of the current relation will no longer be used in joins
	// hence we should push it here
	for (auto &filter_info : filters_and_bindings) {
		// check if the filter has already been extracted
		auto &info = *filter_info;
		if (filters_and_bindings[info.filter_index]->filter) {
			// now check if the filter is a subset of the current relation
			// note that infos with an empty relation set are a special case and we do not push them down
			if (info.set.get().count > 0 && JoinRelationSet::IsSubset(*result_relation, info.set)) {
				auto &filter_and_binding = filters_and_bindings[info.filter_index];
				auto filter = std::move(filter_and_binding->filter);
				// if it is, we can push the filter
				// we can push it either into a join or as a filter
				// check if we are in a join or in a base table
				if (!left_node || !info.left_set) {
					// base table or non-comparison expression, push it as a filter
					result_operator = PushFilter(std::move(result_operator), std::move(filter));
					continue;
				}
				// the node below us is a join or cross product and the expression is a comparison
				// check if the nodes can be split up into left/right
				bool found_subset = false;
				bool invert = false;
				if (JoinRelationSet::IsSubset(*left_node, *info.left_set) &&
				    JoinRelationSet::IsSubset(*right_node, *info.right_set)) {
					found_subset = true;
				} else if (JoinRelationSet::IsSubset(*right_node, *info.left_set) &&
				           JoinRelationSet::IsSubset(*left_node, *info.right_set)) {
					invert = true;
					found_subset = true;
				}
				if (!found_subset) {
					// could not be split up into left/right
					result_operator = PushFilter(std::move(result_operator), std::move(filter));
					continue;
				}
				// create the join condition
				JoinCondition cond;
				D_ASSERT(filter->GetExpressionClass() == ExpressionClass::BOUND_COMPARISON);
				auto &comparison = filter->Cast<BoundComparisonExpression>();
				// we need to figure out which side is which by looking at the relations available to us
				cond.left = !invert ? std::move(comparison.left) : std::move(comparison.right);
				cond.right = !invert ? std::move(comparison.right) : std::move(comparison.left);
				cond.comparison = comparison.GetExpressionType();
				if (invert) {
					// reverse comparison expression if we reverse the order of the children
					cond.comparison = FlipComparisonExpression(comparison.GetExpressionType());
				}
				// now find the join to push it into
				auto node = result_operator.get();
				if (node->type == LogicalOperatorType::LOGICAL_FILTER) {
					node = node->children[0].get();
				}
				if (node->type == LogicalOperatorType::LOGICAL_CROSS_PRODUCT) {
					// turn into comparison join
					auto comp_join = make_uniq<LogicalComparisonJoin>(JoinType::INNER);
					comp_join->children.push_back(std::move(node->children[0]));
					comp_join->children.push_back(std::move(node->children[1]));
					comp_join->conditions.push_back(std::move(cond));
					if (node == result_operator.get()) {
						result_operator = std::move(comp_join);
					} else {
						D_ASSERT(result_operator->type == LogicalOperatorType::LOGICAL_FILTER);
						result_operator->children[0] = std::move(comp_join);
					}
				} else {
					D_ASSERT(node->type == LogicalOperatorType::LOGICAL_COMPARISON_JOIN ||
					         node->type == LogicalOperatorType::LOGICAL_ASOF_JOIN);
					auto &comp_join = node->Cast<LogicalComparisonJoin>();
					comp_join.conditions.push_back(std::move(cond));
				}
			}
		}
	}
	auto result = GenerateJoinRelation(result_relation, std::move(result_operator));
	return result;
}